

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_und(runtime_type *this,var *a,var *b)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  byte extraout_var;
  numeric *this_00;
  numeric *rhs;
  runtime_error *this_01;
  any *in_RCX;
  string local_38;
  
  if (b->mDat == (proxy *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    iVar3 = (*b->mDat->data->_vptr_baseHolder[2])();
    puVar4 = (undefined *)CONCAT44(extraout_var_00,iVar3);
  }
  pcVar1 = *(char **)(puVar4 + 8);
  if (pcVar1 == "N2cs7numericE") {
LAB_0025d749:
    if (in_RCX->mDat == (proxy *)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      iVar3 = (*in_RCX->mDat->data->_vptr_baseHolder[2])();
      puVar4 = (undefined *)CONCAT44(extraout_var_01,iVar3);
    }
    pcVar1 = *(char **)(puVar4 + 8);
    if (pcVar1 == "N2cs7numericE") {
LAB_0025d838:
      this_00 = cs_impl::any::const_val<cs::numeric>(b);
      rhs = cs_impl::any::const_val<cs::numeric>(in_RCX);
      bVar2 = numeric::operator<(this_00,rhs);
      local_38._M_dataplus._M_p._0_1_ = bVar2;
      goto LAB_0025d85b;
    }
    if (*pcVar1 != '*') {
      iVar3 = strcmp(pcVar1,"N2cs7numericE");
      if (iVar3 == 0) goto LAB_0025d838;
    }
  }
  else if (*pcVar1 != '*') {
    iVar3 = strcmp(pcVar1,"N2cs7numericE");
    if (iVar3 == 0) goto LAB_0025d749;
  }
  if (b->mDat == (proxy *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    iVar3 = (*b->mDat->data->_vptr_baseHolder[2])();
    puVar4 = (undefined *)CONCAT44(extraout_var_02,iVar3);
  }
  pcVar1 = *(char **)(puVar4 + 8);
  if (pcVar1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
    if (*pcVar1 == '*') goto LAB_0025d870;
    iVar3 = strcmp(pcVar1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
    if (iVar3 != 0) goto LAB_0025d870;
  }
  if (in_RCX->mDat == (proxy *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    iVar3 = (*in_RCX->mDat->data->_vptr_baseHolder[2])();
    puVar4 = (undefined *)CONCAT44(extraout_var_03,iVar3);
  }
  pcVar1 = *(char **)(puVar4 + 8);
  if (pcVar1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
    if (*pcVar1 == '*') {
LAB_0025d870:
      this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Unsupported operator operations(Und).","");
      runtime_error::runtime_error(this_01,&local_38);
      __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    iVar3 = strcmp(pcVar1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
    if (iVar3 != 0) goto LAB_0025d870;
  }
  pbVar5 = cs_impl::any::const_val<std::__cxx11::string>(b);
  cs_impl::any::const_val<std::__cxx11::string>(in_RCX);
  std::__cxx11::string::compare((string *)pbVar5);
  local_38._M_dataplus._M_p._0_1_ = extraout_var >> 7;
LAB_0025d85b:
  cs_impl::any::any<bool>((any *)this,(bool *)&local_38);
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_und(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return boolean(a.const_val<numeric>() < b.const_val<numeric>());
		else if (a.type() == typeid(string) && b.type() == typeid(string))
			return boolean(a.const_val<string>() < b.const_val<string>());
		else
			throw runtime_error("Unsupported operator operations(Und).");
	}